

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

int __thiscall Map::GenerateItemID(Map *this)

{
  short sVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *plVar3;
  int iVar4;
  _List_node_base *p_Var5;
  
  p_Var5 = (this->items).
           super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  plVar3 = &this->items;
  if (p_Var5 == (_List_node_base *)plVar3) {
    iVar4 = 1;
  }
  else {
    iVar4 = 1;
    do {
      while( true ) {
        p_Var2 = p_Var5[1]._M_next;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5[1]._M_prev;
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          sVar1 = *(short *)&p_Var2->_M_next;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          sVar1 = *(short *)&p_Var2->_M_next;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (iVar4 == sVar1) break;
        p_Var5 = p_Var5->_M_next;
        if (p_Var5 == (_List_node_base *)plVar3) {
          return iVar4;
        }
      }
      iVar4 = sVar1 + 1;
      p_Var5 = (plVar3->
               super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var5 != (_List_node_base *)plVar3);
  }
  return iVar4;
}

Assistant:

int Map::GenerateItemID() const
{
	int lowest_free_id = 1;
	restart_loop:
	UTIL_FOREACH(this->items, item)
	{
		if (item->uid == lowest_free_id)
		{
			lowest_free_id = item->uid + 1;
			goto restart_loop;
		}
	}
	return lowest_free_id;
}